

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O2

void test_qclab_qgates_QGate1<std::complex<double>>(void)

{
  complex<double> m10;
  complex<double> m10_00;
  complex<double> m10_01;
  complex<double> m10_02;
  complex<double> m10_03;
  complex<double> m10_04;
  complex<double> m10_05;
  complex<double> m10_06;
  complex<double> m11;
  complex<double> m11_00;
  complex<double> m11_01;
  complex<double> m11_02;
  complex<double> m11_03;
  complex<double> m11_04;
  complex<double> m11_05;
  complex<double> m11_06;
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  pointer *__ptr;
  undefined8 *puVar4;
  SquareMatrix<std::complex<double>_> *pSVar5;
  RotationY<std::complex<double>_> *pRVar6;
  QObject<std::complex<double>_> QVar7;
  SquareMatrix<std::complex<double>_> *pSVar8;
  char *in_R9;
  char *pcVar9;
  byte bVar10;
  initializer_list<std::complex<double>_> __l;
  initializer_list<std::complex<double>_> __l_00;
  initializer_list<std::complex<double>_> __l_01;
  initializer_list<std::complex<double>_> __l_02;
  initializer_list<std::complex<double>_> __l_03;
  initializer_list<std::complex<double>_> __l_04;
  initializer_list<std::complex<double>_> __l_05;
  initializer_list<std::complex<double>_> __l_06;
  initializer_list<std::complex<double>_> __l_07;
  complex<double> m00;
  complex<double> m00_00;
  complex<double> m00_01;
  complex<double> m00_02;
  complex<double> m00_03;
  complex<double> m00_04;
  complex<double> m00_05;
  complex<double> m00_06;
  complex<double> m01;
  complex<double> m01_00;
  complex<double> m01_01;
  complex<double> m01_02;
  complex<double> m01_03;
  complex<double> m01_04;
  complex<double> m01_05;
  complex<double> m01_06;
  AssertionResult gtest_ar__3;
  V check3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1b0;
  V vec3;
  V vec1;
  PauliX<std::complex<double>_> X;
  AssertHelper local_158;
  V check2;
  V vec2;
  V check1;
  SquareMatrix<std::complex<double>_> I1;
  RotationY<std::complex<double>_> Y_1;
  SquareMatrix<std::complex<double>_> I2;
  SquareMatrix<std::complex<double>_> I3;
  V v3;
  V v2;
  V v1;
  
  bVar10 = 0;
  qclab::dense::eye<std::complex<double>>((int64_t)&I1);
  qclab::dense::eye<std::complex<double>>((int64_t)&I2);
  qclab::dense::eye<std::complex<double>>((int64_t)&I3);
  Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.cos_ =
       (double)&DAT_4014000000000000;
  Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.sin_ = 0.0;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&DAT_4008000000000000;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.qubit_ = 0;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>._12_4_ = 0;
  __l._M_len = 2;
  __l._M_array = (iterator)&Y_1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&v1,__l,(allocator_type *)&vec1);
  Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.cos_ =
       (double)&DAT_4014000000000000;
  Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.sin_ = 0.0;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&DAT_4008000000000000;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.qubit_ = 0;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>._12_4_ = 0;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&Y_1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&v2,__l_00,(allocator_type *)&vec1);
  puVar4 = &DAT_003be770;
  pRVar6 = &Y_1;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pRVar6->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)*puVar4;
    puVar4 = puVar4 + (ulong)bVar10 * -2 + 1;
    pRVar6 = (RotationY<std::complex<double>_> *)((long)pRVar6 + ((ulong)bVar10 * -4 + 2) * 4);
  }
  __l_01._M_len = 8;
  __l_01._M_array = (iterator)&Y_1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&v3,__l_01,(allocator_type *)&vec1);
  qclab::qgates::PauliX<std::complex<double>_>::PauliX(&X,0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector(&vec1,&v1);
  qclab::qgates::PauliX<std::complex<double>_>::apply(&X,NoTrans,1,&vec1,0);
  Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.cos_ =
       (double)&DAT_4008000000000000;
  Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.sin_ = 0.0;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&DAT_4014000000000000;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.qubit_ = 0;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>._12_4_ = 0;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&Y_1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&check1,__l_02,(allocator_type *)&vec2);
  vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = std::operator==(&vec1,&check1);
  vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)(char)vec2.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
    testing::Message::Message((Message *)&check2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec2,(AssertionResult *)"vec1 == check1","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vec3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x1d,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&vec3,(Message *)&check2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vec3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check2.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         check2.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check2.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     check2.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec2.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector(&vec2,&v2);
  qclab::qgates::PauliX<std::complex<double>_>::apply(&X,NoTrans,2,&vec2,0);
  Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.cos_ =
       (double)&DAT_401c000000000000;
  Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.sin_ = 0.0;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&DAT_4000000000000000;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.qubit_ = 0;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>._12_4_ = 0;
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)&Y_1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&check2,__l_03,(allocator_type *)&vec3);
  vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = std::operator==(&vec2,&check2);
  vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)(char)vec3.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
    testing::Message::Message((Message *)&check3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec3,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x29,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&check3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check3.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)check3.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check3.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)check3.
                                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec3.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  X.super_QGate1<std::complex<double>_>.qubit_ = 1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=(&vec2,&v2);
  qclab::qgates::PauliX<std::complex<double>_>::apply(&X,NoTrans,2,&vec2,0);
  Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.cos_ =
       (double)&DAT_4008000000000000;
  Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.sin_ = 0.0;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&DAT_4014000000000000;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.qubit_ = 0;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>._12_4_ = 0;
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&check2,&Y_1);
  vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = std::operator==(&vec2,&check2);
  vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)(char)vec3.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
    testing::Message::Message((Message *)&check3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec3,(AssertionResult *)"vec2 == check2","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x35,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&check3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check3.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)check3.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check3.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)check3.
                                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec3.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector(&vec3,&v3);
  qclab::qgates::PauliX<std::complex<double>_>::apply(&X,NoTrans,3,&vec3,0);
  puVar4 = &DAT_003be870;
  pRVar6 = &Y_1;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pRVar6->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)*puVar4;
    puVar4 = puVar4 + (ulong)bVar10 * -2 + 1;
    pRVar6 = (RotationY<std::complex<double>_> *)((long)pRVar6 + ((ulong)bVar10 * -4 + 2) * 4);
  }
  __l_04._M_len = 8;
  __l_04._M_array = (iterator)&Y_1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&check3,__l_04,(allocator_type *)&gtest_ar__3);
  gtest_ar__3.success_ = std::operator==(&vec3,&check3);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__3.success_) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&gtest_ar__3,(AssertionResult *)"vec3 == check3","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x41,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&Y_1);
    if (local_1b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1b0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  X.super_QGate1<std::complex<double>_>._8_8_ =
       X.super_QGate1<std::complex<double>_>._8_8_ & 0xffffffff00000000;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=(&vec3,&v3);
  qclab::qgates::PauliX<std::complex<double>_>::apply(&X,NoTrans,3,&vec3,0);
  puVar4 = &DAT_003be8f0;
  pRVar6 = &Y_1;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pRVar6->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)*puVar4;
    puVar4 = puVar4 + (ulong)bVar10 * -2 + 1;
    pRVar6 = (RotationY<std::complex<double>_> *)((long)pRVar6 + ((ulong)bVar10 * -4 + 2) * 4);
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&check3,&Y_1,&I2);
  gtest_ar__3.success_ = std::operator==(&vec3,&check3);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__3.success_) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&gtest_ar__3,(AssertionResult *)"vec3 == check3","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x4d,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&Y_1);
    if (local_1b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1b0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  X.super_QGate1<std::complex<double>_>.qubit_ = 2;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=(&vec3,&v3);
  qclab::qgates::PauliX<std::complex<double>_>::apply(&X,NoTrans,3,&vec3,0);
  puVar4 = &DAT_003be970;
  pRVar6 = &Y_1;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pRVar6->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)*puVar4;
    puVar4 = puVar4 + (ulong)bVar10 * -2 + 1;
    pRVar6 = (RotationY<std::complex<double>_> *)((long)pRVar6 + ((ulong)bVar10 * -4 + 2) * 4);
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&check3,&Y_1,&I2);
  gtest_ar__3.success_ = std::operator==(&vec3,&check3);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__3.success_) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&gtest_ar__3,(AssertionResult *)"vec3 == check3","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x59,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&Y_1);
    if (local_1b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1b0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
  ;
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
  ;
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
  ;
  qclab::qgates::RotationY<std::complex<double>_>::RotationY
            ((RotationY<std::complex<double>_> *)&vec1,0,0.0,1.0,false);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector(&check1,&v1);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&vec1,Trans,1,&check1,0);
  Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.cos_ = -3.0;
  Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.sin_ = 0.0;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&DAT_4014000000000000;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.qubit_ = 0;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>._12_4_ = 0;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&Y_1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&vec2,__l_05,(allocator_type *)&check2);
  check2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = std::operator==(&check1,&vec2);
  check2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)check2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&vec3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&check2,(AssertionResult *)"vec1 == check1","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&check3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x6a,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&check3,(Message *)&vec3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&check3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(vec3.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)vec3.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(vec3.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)vec3.
                                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check2.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector(&check2,&v2);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&vec1,Trans,2,&check2,0);
  Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.cos_ =
       (double)&DAT_401c000000000000;
  Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.sin_ = 0.0;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&DAT_4000000000000000;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.qubit_ = 0;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>._12_4_ = 0;
  __l_06._M_len = 4;
  __l_06._M_array = (iterator)&Y_1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            (&vec3,__l_06,(allocator_type *)&check3);
  check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = std::operator==(&check2,&vec3);
  check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)(char)check3.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
    testing::Message::Message((Message *)&X);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&check3,(AssertionResult *)"vec2 == check2","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x76,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&X);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(X.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
                         _vptr_QObject._1_7_,
                         (char)X.super_QGate1<std::complex<double>_>.
                               super_QObject<std::complex<double>_>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(X.super_QGate1<std::complex<double>_>.
                                     super_QObject<std::complex<double>_>._vptr_QObject._1_7_,
                                     (char)X.super_QGate1<std::complex<double>_>.
                                           super_QObject<std::complex<double>_>._vptr_QObject) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check3.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=(&check2,&v2);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&vec1,Trans,2,&check2,0);
  Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.cos_ = -3.0;
  Y_1.super_QRotationGate1<std::complex<double>_>.rotation_.angle_.sin_ = 0.0;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&DAT_4014000000000000;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.qubit_ = 0;
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>._12_4_ = 0;
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&vec3,&Y_1);
  check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = std::operator==(&check2,&vec3);
  check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)(char)check3.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
    testing::Message::Message((Message *)&X);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&check3,(AssertionResult *)"vec2 == check2","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x82,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&X);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(X.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
                         _vptr_QObject._1_7_,
                         (char)X.super_QGate1<std::complex<double>_>.
                               super_QObject<std::complex<double>_>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(X.super_QGate1<std::complex<double>_>.
                                     super_QObject<std::complex<double>_>._vptr_QObject._1_7_,
                                     (char)X.super_QGate1<std::complex<double>_>.
                                           super_QObject<std::complex<double>_>._vptr_QObject) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check3.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector(&check3,&v3);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&vec1,Trans,3,&check3,0);
  puVar4 = &DAT_003bea70;
  pRVar6 = &Y_1;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pRVar6->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)*puVar4;
    puVar4 = puVar4 + (ulong)bVar10 * -2 + 1;
    pRVar6 = (RotationY<std::complex<double>_> *)((long)pRVar6 + ((ulong)bVar10 * -4 + 2) * 4);
  }
  __l_07._M_len = 8;
  __l_07._M_array = (iterator)&Y_1;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&X,__l_07,
             (allocator_type *)&gtest_ar__3);
  gtest_ar__3.success_ =
       std::operator==(&check3,(vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                *)&X);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__3.success_) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&gtest_ar__3,(AssertionResult *)"vec3 == check3","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x8e,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&Y_1);
    if (local_1b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1b0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=(&check3,&v3);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&vec1,Trans,3,&check3,0);
  puVar4 = &DAT_003beaf0;
  pRVar6 = &Y_1;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pRVar6->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)*puVar4;
    puVar4 = puVar4 + (ulong)bVar10 * -2 + 1;
    pRVar6 = (RotationY<std::complex<double>_> *)((long)pRVar6 + ((ulong)bVar10 * -4 + 2) * 4);
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&X,&Y_1,&I2);
  gtest_ar__3.success_ =
       std::operator==(&check3,(vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                *)&X);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__3.success_) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&gtest_ar__3,(AssertionResult *)"vec3 == check3","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x9a,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&Y_1);
    if (local_1b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1b0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 2;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator=(&check3,&v3);
  qclab::qgates::RotationY<std::complex<double>_>::apply
            ((RotationY<std::complex<double>_> *)&vec1,Trans,3,&check3,0);
  puVar4 = &DAT_003beb70;
  pRVar6 = &Y_1;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pRVar6->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>.
    super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)*puVar4;
    puVar4 = puVar4 + (ulong)bVar10 * -2 + 1;
    pRVar6 = (RotationY<std::complex<double>_> *)((long)pRVar6 + ((ulong)bVar10 * -4 + 2) * 4);
  }
  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
  _M_assign_aux<std::complex<double>const*>
            ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&X,&Y_1,&I2);
  gtest_ar__3.success_ =
       std::operator==(&check3,(vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                *)&X);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__3.success_) {
    testing::Message::Message((Message *)&local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&gtest_ar__3,(AssertionResult *)"vec3 == check3","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xa6,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&Y_1);
    if (local_1b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1b0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__3.message_);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&X);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
  ;
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
  ;
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>);
  qclab::qgates::PauliX<std::complex<double>_>::PauliX((PauliX<std::complex<double>_> *)&vec1,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&check1,&I1);
  uVar2 = 1;
  QVar7._vptr_QObject = (_func_int **)&check1;
  pcVar9 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&vec1,Left,NoTrans,1,
             (SquareMatrix<std::complex<double>_> *)QVar7._vptr_QObject,0);
  qclab::qgates::PauliX<std::complex<double>_>::matrix((PauliX<std::complex<double>_> *)&Y_1);
  pSVar5 = (SquareMatrix<std::complex<double>_> *)&Y_1;
  vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&check1,pSVar5);
  vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
              qubit_);
  if ((char)vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&check2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec2,(AssertionResult *)"mat1 == X.matrix()","false",
               "true",pcVar9);
    uVar2 = 0xb7;
    QVar7 = Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vec3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xb7,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    pSVar5 = (SquareMatrix<std::complex<double>_> *)&check2;
    testing::internal::AssertHelper::operator=((AssertHelper *)&vec3,(Message *)pSVar5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vec3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check2.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         check2.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check2.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     check2.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec2.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  m10._M_value._1_7_ = gtest_ar__3._1_7_;
  m10._M_value[0] = gtest_ar__3.success_;
  m10._M_value._8_8_ =
       gtest_ar__3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  m11._M_value._1_7_ =
       check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start._1_7_;
  m11._M_value[0] =
       (char)check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  m11._M_value._8_8_ =
       check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  m00._M_value._8_8_ = extraout_RDX;
  m00._M_value._0_8_ = pSVar5;
  m01._M_value._8_8_ = QVar7._vptr_QObject;
  m01._M_value._0_8_ = uVar2;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&Y_1,m00,m01,m10,m11);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&check1,
             (SquareMatrix<std::complex<double>_> *)&Y_1);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
              qubit_);
  uVar2 = 0x4c;
  uVar3 = 1;
  pSVar5 = (SquareMatrix<std::complex<double>_> *)&check1;
  pcVar9 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&vec1,Left,NoTrans,1,pSVar5,0);
  m10_00._M_value._1_7_ = gtest_ar__3._1_7_;
  m10_00._M_value[0] = gtest_ar__3.success_;
  m10_00._M_value._8_8_ =
       gtest_ar__3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  m11_00._M_value._1_7_ =
       check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start._1_7_;
  m11_00._M_value[0] =
       (char)check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  m11_00._M_value._8_8_ =
       check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  m00_00._M_value._8_8_ = extraout_RDX_00;
  m00_00._M_value._0_8_ = uVar2;
  m01_00._M_value._8_8_ = pSVar5;
  m01_00._M_value._0_8_ = uVar3;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&vec2,m00_00,m01_00,m10_00,m11_00);
  check2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&check1,
                  (SquareMatrix<std::complex<double>_> *)&vec2);
  check2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)check2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&vec3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&check2,(AssertionResult *)"mat1 == check1","false","true"
               ,pcVar9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&check3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xbd,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&check3,(Message *)&vec3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&check3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(vec3.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)vec3.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(vec3.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)vec3.
                                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check2.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&check2,&I2);
  pcVar9 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&vec1,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)&check2,0);
  qclab::qgates::PauliX<std::complex<double>_>::matrix((PauliX<std::complex<double>_> *)&check3);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&Y_1,(SquareMatrix<std::complex<double>_> *)&check3,&I1);
  vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&check2,
                  (SquareMatrix<std::complex<double>_> *)&Y_1);
  vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
              qubit_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  if ((char)vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&check3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec3,
               (AssertionResult *)"mat2 == qclab::dense::kron( X.matrix() , I1 )","false","true",
               pcVar9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xc2,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&X,(Message *)&check3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check3.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)check3.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check3.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)check3.
                                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec3.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 1;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&check2,&I2);
  pcVar9 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&vec1,Left,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)&check2,0);
  qclab::qgates::PauliX<std::complex<double>_>::matrix((PauliX<std::complex<double>_> *)&check3);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&Y_1,&I1,(SquareMatrix<std::complex<double>_> *)&check3);
  vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&check2,
                  (SquareMatrix<std::complex<double>_> *)&Y_1);
  vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
              qubit_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  if ((char)vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&check3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec3,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , X.matrix() )","false","true",
               pcVar9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,199,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                            super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>
                            ._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&X,(Message *)&check3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check3.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)check3.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check3.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)check3.
                                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec3.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&vec3,&I3);
  pcVar9 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&vec1,Left,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)&vec3,0);
  qclab::qgates::PauliX<std::complex<double>_>::matrix
            ((PauliX<std::complex<double>_> *)&gtest_ar__3);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&X,(SquareMatrix<std::complex<double>_> *)&gtest_ar__3,&I1);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&Y_1,&I1,(SquareMatrix<std::complex<double>_> *)&X);
  check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&vec3,
                  (SquareMatrix<std::complex<double>_> *)&Y_1);
  check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
              qubit_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &X.super_QGate1<std::complex<double>_>.qubit_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &gtest_ar__3.message_);
  if ((char)check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&X);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&check3,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( X.matrix() , I1 ) )","false",
               "true",pcVar9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xcd,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&X);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(X.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
                         _vptr_QObject._1_7_,
                         (char)X.super_QGate1<std::complex<double>_>.
                               super_QObject<std::complex<double>_>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(X.super_QGate1<std::complex<double>_>.
                                     super_QObject<std::complex<double>_>._vptr_QObject._1_7_,
                                     (char)X.super_QGate1<std::complex<double>_>.
                                           super_QObject<std::complex<double>_>._vptr_QObject) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check3.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  qclab::qgates::PauliX<std::complex<double>_>::PauliX((PauliX<std::complex<double>_> *)&vec1,0);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&check1,&I1);
  uVar2 = 1;
  QVar7._vptr_QObject = (_func_int **)&check1;
  pcVar9 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&vec1,Right,NoTrans,1,
             (SquareMatrix<std::complex<double>_> *)QVar7._vptr_QObject,0);
  qclab::qgates::PauliX<std::complex<double>_>::matrix((PauliX<std::complex<double>_> *)&Y_1);
  pSVar5 = (SquareMatrix<std::complex<double>_> *)&Y_1;
  vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&check1,pSVar5);
  vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
              qubit_);
  if ((char)vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&check2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec2,(AssertionResult *)"mat1 == X.matrix()","false",
               "true",pcVar9);
    uVar2 = 0xd7;
    QVar7 = Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
            super_QObject<std::complex<double>_>;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&vec3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xd7,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    pSVar5 = (SquareMatrix<std::complex<double>_> *)&check2;
    testing::internal::AssertHelper::operator=((AssertHelper *)&vec3,(Message *)pSVar5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&vec3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check2.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         check2.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check2.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     check2.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec2.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  m10_01._M_value._1_7_ = gtest_ar__3._1_7_;
  m10_01._M_value[0] = gtest_ar__3.success_;
  m10_01._M_value._8_8_ =
       gtest_ar__3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  m11_01._M_value._1_7_ =
       check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start._1_7_;
  m11_01._M_value[0] =
       (char)check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  m11_01._M_value._8_8_ =
       check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  m00_01._M_value._8_8_ = extraout_RDX_01;
  m00_01._M_value._0_8_ = pSVar5;
  m01_01._M_value._8_8_ = QVar7._vptr_QObject;
  m01_01._M_value._0_8_ = uVar2;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&Y_1,m00_01,m01_01,m10_01,m11_01);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&check1,
             (SquareMatrix<std::complex<double>_> *)&Y_1);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
              qubit_);
  uVar2 = 0x52;
  uVar3 = 1;
  pSVar5 = (SquareMatrix<std::complex<double>_> *)&check1;
  pcVar9 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&vec1,Right,NoTrans,1,pSVar5,0);
  m10_02._M_value._1_7_ = gtest_ar__3._1_7_;
  m10_02._M_value[0] = gtest_ar__3.success_;
  m10_02._M_value._8_8_ =
       gtest_ar__3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  m11_02._M_value._1_7_ =
       check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start._1_7_;
  m11_02._M_value[0] =
       (char)check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  m11_02._M_value._8_8_ =
       check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  m00_02._M_value._8_8_ = extraout_RDX_02;
  m00_02._M_value._0_8_ = uVar2;
  m01_02._M_value._8_8_ = pSVar5;
  m01_02._M_value._0_8_ = uVar3;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&vec2,m00_02,m01_02,m10_02,m11_02);
  check2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&check1,
                  (SquareMatrix<std::complex<double>_> *)&vec2);
  check2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)check2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&vec3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&check2,(AssertionResult *)"mat1 == check1","false","true"
               ,pcVar9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&check3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xdd,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&check3,(Message *)&vec3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&check3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(vec3.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)vec3.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(vec3.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)vec3.
                                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check2.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&check2,&I2);
  pcVar9 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&vec1,Right,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)&check2,0);
  qclab::qgates::PauliX<std::complex<double>_>::matrix((PauliX<std::complex<double>_> *)&check3);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&Y_1,(SquareMatrix<std::complex<double>_> *)&check3,&I1);
  vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&check2,
                  (SquareMatrix<std::complex<double>_> *)&Y_1);
  vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
              qubit_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  if ((char)vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&check3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec3,
               (AssertionResult *)"mat2 == qclab::dense::kron( X.matrix() , I1 )","false","true",
               pcVar9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xe2,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&X,(Message *)&check3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check3.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)check3.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check3.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)check3.
                                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec3.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 1;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&check2,&I2);
  pcVar9 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&vec1,Right,NoTrans,2,
             (SquareMatrix<std::complex<double>_> *)&check2,0);
  qclab::qgates::PauliX<std::complex<double>_>::matrix((PauliX<std::complex<double>_> *)&check3);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&Y_1,&I1,(SquareMatrix<std::complex<double>_> *)&check3);
  vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&check2,
                  (SquareMatrix<std::complex<double>_> *)&Y_1);
  vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
              qubit_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  if ((char)vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&check3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&vec3,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , X.matrix() )","false","true",
               pcVar9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xe7,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&X,(Message *)&check3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(check3.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)check3.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check3.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)check3.
                                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec3.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&vec3,&I3);
  pcVar9 = (char *)0x0;
  qclab::qgates::PauliX<std::complex<double>_>::apply
            ((PauliX<std::complex<double>_> *)&vec1,Right,NoTrans,3,
             (SquareMatrix<std::complex<double>_> *)&vec3,0);
  qclab::qgates::PauliX<std::complex<double>_>::matrix
            ((PauliX<std::complex<double>_> *)&gtest_ar__3);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&X,(SquareMatrix<std::complex<double>_> *)&gtest_ar__3,&I1);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&Y_1,&I1,(SquareMatrix<std::complex<double>_> *)&X);
  check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&vec3,
                  (SquareMatrix<std::complex<double>_> *)&Y_1);
  check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.
              qubit_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &X.super_QGate1<std::complex<double>_>.qubit_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &gtest_ar__3.message_);
  if ((char)check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&X);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&Y_1,(internal *)&check3,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( X.matrix() , I1 ) )","false",
               "true",pcVar9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xed,(char *)Y_1.super_QRotationGate1<std::complex<double>_>.
                             super_QGate1<std::complex<double>_>.
                             super_QObject<std::complex<double>_>._vptr_QObject);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&X);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&Y_1);
    if ((long *)CONCAT71(X.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
                         _vptr_QObject._1_7_,
                         (char)X.super_QGate1<std::complex<double>_>.
                               super_QObject<std::complex<double>_>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(X.super_QGate1<std::complex<double>_>.
                                     super_QObject<std::complex<double>_>._vptr_QObject._1_7_,
                                     (char)X.super_QGate1<std::complex<double>_>.
                                           super_QObject<std::complex<double>_>._vptr_QObject) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check3.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  qclab::qgates::RotationY<std::complex<double>_>::RotationY(&Y_1,0,0.0,1.0,false);
  qclab::qgates::RotationY<std::complex<double>_>::matrix((RotationY<std::complex<double>_> *)&vec1)
  ;
  qclab::dense::trans<qclab::dense::SquareMatrix<std::complex<double>>>
            ((dense *)&check1,(SquareMatrix<std::complex<double>_> *)&vec1);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&vec2,&I1);
  uVar2 = 1;
  pSVar8 = (SquareMatrix<std::complex<double>_> *)&vec2;
  pcVar9 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply(&Y_1,Left,Trans,1,pSVar8,0);
  pSVar5 = (SquareMatrix<std::complex<double>_> *)&check1;
  check2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&vec2,pSVar5);
  check2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)check2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&vec3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&check2,(AssertionResult *)"mat1 == Ytrans","false",
               "true",pcVar9);
    uVar2 = 0xf8;
    pSVar8 = (SquareMatrix<std::complex<double>_> *)
             vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&check3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xf8,(char *)vec1.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    pSVar5 = (SquareMatrix<std::complex<double>_> *)&vec3;
    testing::internal::AssertHelper::operator=((AssertHelper *)&check3,(Message *)pSVar5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&check3);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(vec3.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)vec3.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(vec3.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)vec3.
                                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check2.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  m10_03._M_value._1_7_ = gtest_ar__3._1_7_;
  m10_03._M_value[0] = gtest_ar__3.success_;
  m10_03._M_value._8_8_ =
       gtest_ar__3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  m11_03._M_value._1_7_ =
       check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start._1_7_;
  m11_03._M_value[0] =
       (char)check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  m11_03._M_value._8_8_ =
       check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  m00_03._M_value._8_8_ = extraout_RDX_03;
  m00_03._M_value._0_8_ = pSVar5;
  m01_03._M_value._8_8_ = pSVar8;
  m01_03._M_value._0_8_ = uVar2;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&vec1,m00_03,m01_03,m10_03,m11_03);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&vec2,
             (SquareMatrix<std::complex<double>_> *)&vec1);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  uVar2 = 0x4c;
  uVar3 = 1;
  pSVar5 = (SquareMatrix<std::complex<double>_> *)&vec2;
  pcVar9 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply(&Y_1,Left,Trans,1,pSVar5,0);
  m10_04._M_value._1_7_ = gtest_ar__3._1_7_;
  m10_04._M_value[0] = gtest_ar__3.success_;
  m10_04._M_value._8_8_ =
       gtest_ar__3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  m11_04._M_value._1_7_ =
       check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start._1_7_;
  m11_04._M_value[0] =
       (char)check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  m11_04._M_value._8_8_ =
       check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  m00_04._M_value._8_8_ = extraout_RDX_04;
  m00_04._M_value._0_8_ = uVar2;
  m01_04._M_value._8_8_ = pSVar5;
  m01_04._M_value._0_8_ = uVar3;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&check2,m00_04,m01_04,m10_04,m11_04);
  vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&vec2,
                  (SquareMatrix<std::complex<double>_> *)&check2);
  vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)(char)vec3.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
    testing::Message::Message((Message *)&check3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&vec3,(AssertionResult *)"mat1 == check1","false","true",
               pcVar9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0xfe,(char *)vec1.
                             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&X,(Message *)&check3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(check3.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)check3.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check3.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)check3.
                                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec3.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&vec3,&I2);
  pcVar9 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            (&Y_1,Left,Trans,2,(SquareMatrix<std::complex<double>_> *)&vec3,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&vec1,(SquareMatrix<std::complex<double>_> *)&check1,&I1);
  check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&vec3,
                  (SquareMatrix<std::complex<double>_> *)&vec1);
  check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  if ((char)check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&X);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&check3,
               (AssertionResult *)"mat2 == qclab::dense::kron( Ytrans , I1 )","false","true",pcVar9)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x103,(char *)vec1.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&X);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(X.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
                         _vptr_QObject._1_7_,
                         (char)X.super_QGate1<std::complex<double>_>.
                               super_QObject<std::complex<double>_>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(X.super_QGate1<std::complex<double>_>.
                                     super_QObject<std::complex<double>_>._vptr_QObject._1_7_,
                                     (char)X.super_QGate1<std::complex<double>_>.
                                           super_QObject<std::complex<double>_>._vptr_QObject) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check3.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.qubit_ = 1;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&vec3,&I2);
  pcVar9 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            (&Y_1,Left,Trans,2,(SquareMatrix<std::complex<double>_> *)&vec3,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&vec1,&I1,(SquareMatrix<std::complex<double>_> *)&check1);
  check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&vec3,
                  (SquareMatrix<std::complex<double>_> *)&vec1);
  check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  if ((char)check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&X);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&check3,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , Ytrans )","false","true",pcVar9)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x108,(char *)vec1.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&X);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(X.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
                         _vptr_QObject._1_7_,
                         (char)X.super_QGate1<std::complex<double>_>.
                               super_QObject<std::complex<double>_>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(X.super_QGate1<std::complex<double>_>.
                                     super_QObject<std::complex<double>_>._vptr_QObject._1_7_,
                                     (char)X.super_QGate1<std::complex<double>_>.
                                           super_QObject<std::complex<double>_>._vptr_QObject) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check3.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&check3,&I3);
  pcVar9 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            (&Y_1,Left,Trans,3,(SquareMatrix<std::complex<double>_> *)&check3,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&gtest_ar__3,(SquareMatrix<std::complex<double>_> *)&check1,&I1);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&vec1,&I1,(SquareMatrix<std::complex<double>_> *)&gtest_ar__3);
  X.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&check3,
                  (SquareMatrix<std::complex<double>_> *)&vec1);
  X.super_QGate1<std::complex<double>_>.qubit_ = 0;
  X.super_QGate1<std::complex<double>_>._12_4_ = 0;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &gtest_ar__3.message_);
  if ((char)X.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
      == '\0') {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&X,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( Ytrans , I1 ) )","false","true"
               ,pcVar9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x10e,(char *)vec1.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1b0,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1b0);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&X.super_QGate1<std::complex<double>_>.qubit_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  qclab::qgates::RotationY<std::complex<double>_>::RotationY(&Y_1,0,0.0,1.0,false);
  qclab::qgates::RotationY<std::complex<double>_>::matrix((RotationY<std::complex<double>_> *)&vec1)
  ;
  qclab::dense::trans<qclab::dense::SquareMatrix<std::complex<double>>>
            ((dense *)&check1,(SquareMatrix<std::complex<double>_> *)&vec1);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&vec2,&I1);
  uVar2 = 1;
  pSVar8 = (SquareMatrix<std::complex<double>_> *)&vec2;
  pcVar9 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply(&Y_1,Right,Trans,1,pSVar8,0);
  pSVar5 = (SquareMatrix<std::complex<double>_> *)&check1;
  check2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&vec2,pSVar5);
  check2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)check2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start._0_1_) {
    testing::Message::Message((Message *)&vec3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&check2,(AssertionResult *)"mat1 == Ytrans","false",
               "true",pcVar9);
    uVar2 = 0x119;
    pSVar8 = (SquareMatrix<std::complex<double>_> *)
             vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&check3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x119,(char *)vec1.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    pSVar5 = (SquareMatrix<std::complex<double>_> *)&vec3;
    testing::internal::AssertHelper::operator=((AssertHelper *)&check3,(Message *)pSVar5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&check3);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(vec3.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)vec3.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(vec3.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)vec3.
                                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check2.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  m10_05._M_value._1_7_ = gtest_ar__3._1_7_;
  m10_05._M_value[0] = gtest_ar__3.success_;
  m10_05._M_value._8_8_ =
       gtest_ar__3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  m11_05._M_value._1_7_ =
       check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start._1_7_;
  m11_05._M_value[0] =
       (char)check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  m11_05._M_value._8_8_ =
       check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  m00_05._M_value._8_8_ = extraout_RDX_05;
  m00_05._M_value._0_8_ = pSVar5;
  m01_05._M_value._8_8_ = pSVar8;
  m01_05._M_value._0_8_ = uVar2;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&vec1,m00_05,m01_05,m10_05,m11_05);
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&vec2,
             (SquareMatrix<std::complex<double>_> *)&vec1);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  uVar2 = 0x52;
  uVar3 = 1;
  pSVar5 = (SquareMatrix<std::complex<double>_> *)&vec2;
  pcVar9 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply(&Y_1,Right,Trans,1,pSVar5,0);
  m10_06._M_value._1_7_ = gtest_ar__3._1_7_;
  m10_06._M_value[0] = gtest_ar__3.success_;
  m10_06._M_value._8_8_ =
       gtest_ar__3.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  m11_06._M_value._1_7_ =
       check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_start._1_7_;
  m11_06._M_value[0] =
       (char)check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  m11_06._M_value._8_8_ =
       check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  m00_06._M_value._8_8_ = extraout_RDX_06;
  m00_06._M_value._0_8_ = uVar2;
  m01_06._M_value._8_8_ = pSVar5;
  m01_06._M_value._0_8_ = uVar3;
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&check2,m00_06,m01_06,m10_06,m11_06);
  vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&vec2,
                  (SquareMatrix<std::complex<double>_> *)&check2);
  vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!(bool)(char)vec3.
                   super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) {
    testing::Message::Message((Message *)&check3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&vec3,(AssertionResult *)"mat1 == check1","false","true",
               pcVar9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&X,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x11f,(char *)vec1.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&X,(Message *)&check3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&X);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(check3.
                         super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)check3.
                               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(check3.
                                     super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)check3.
                                           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&vec3.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&vec3,&I2);
  pcVar9 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            (&Y_1,Right,Trans,2,(SquareMatrix<std::complex<double>_> *)&vec3,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&vec1,(SquareMatrix<std::complex<double>_> *)&check1,&I1);
  check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&vec3,
                  (SquareMatrix<std::complex<double>_> *)&vec1);
  check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  if ((char)check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&X);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&check3,
               (AssertionResult *)"mat2 == qclab::dense::kron( Ytrans , I1 )","false","true",pcVar9)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x124,(char *)vec1.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&X);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(X.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
                         _vptr_QObject._1_7_,
                         (char)X.super_QGate1<std::complex<double>_>.
                               super_QObject<std::complex<double>_>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(X.super_QGate1<std::complex<double>_>.
                                     super_QObject<std::complex<double>_>._vptr_QObject._1_7_,
                                     (char)X.super_QGate1<std::complex<double>_>.
                                           super_QObject<std::complex<double>_>._vptr_QObject) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check3.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  Y_1.super_QRotationGate1<std::complex<double>_>.super_QGate1<std::complex<double>_>.qubit_ = 1;
  qclab::dense::SquareMatrix<std::complex<double>_>::operator=
            ((SquareMatrix<std::complex<double>_> *)&vec3,&I2);
  pcVar9 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            (&Y_1,Right,Trans,2,(SquareMatrix<std::complex<double>_> *)&vec3,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&vec1,&I1,(SquareMatrix<std::complex<double>_> *)&check1);
  check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&vec3,
                  (SquareMatrix<std::complex<double>_> *)&vec1);
  check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  if ((char)check3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&X);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&check3,
               (AssertionResult *)"mat2 == qclab::dense::kron( I1 , Ytrans )","false","true",pcVar9)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x129,(char *)vec1.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&X);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(X.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
                         _vptr_QObject._1_7_,
                         (char)X.super_QGate1<std::complex<double>_>.
                               super_QObject<std::complex<double>_>._vptr_QObject) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(X.super_QGate1<std::complex<double>_>.
                                     super_QObject<std::complex<double>_>._vptr_QObject._1_7_,
                                     (char)X.super_QGate1<std::complex<double>_>.
                                           super_QObject<std::complex<double>_>._vptr_QObject) + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&check3.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  qclab::dense::SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&check3,&I3);
  pcVar9 = (char *)0x0;
  qclab::qgates::RotationY<std::complex<double>_>::apply
            (&Y_1,Right,Trans,3,(SquareMatrix<std::complex<double>_> *)&check3,0);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&gtest_ar__3,(SquareMatrix<std::complex<double>_> *)&check1,&I1);
  qclab::dense::kron<std::complex<double>>
            ((dense *)&vec1,&I1,(SquareMatrix<std::complex<double>_> *)&gtest_ar__3);
  X.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject._0_1_ =
       qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                 ((SquareMatrix<std::complex<double>_> *)&check3,
                  (SquareMatrix<std::complex<double>_> *)&vec1);
  X.super_QGate1<std::complex<double>_>.qubit_ = 0;
  X.super_QGate1<std::complex<double>_>._12_4_ = 0;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &gtest_ar__3.message_);
  if ((char)X.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>._vptr_QObject
      == '\0') {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&vec1,(internal *)&X,
               (AssertionResult *)
               "mat3 == qclab::dense::kron( I1 , qclab::dense::kron( Ytrans , I1 ) )","false","true"
               ,pcVar9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/qgates/QGate1.cpp"
               ,0x12f,(char *)vec1.
                              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1b0,(Message *)&gtest_ar__3);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1b0);
    std::__cxx11::string::~string((string *)&vec1);
    if ((long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__3._1_7_,gtest_ar__3.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&X.super_QGate1<std::complex<double>_>.qubit_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &check3.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &check2.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &vec2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &check1.
              super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
              _M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&v3.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&v2.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>);
  std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
            (&v1.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&I3.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&I2.data_);
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            (&I1.data_);
  return;
}

Assistant:

void test_qclab_qgates_QGate1() {

  using R = qclab::real_t< T > ;
  using V = std::vector< T > ;
  using M = qclab::dense::SquareMatrix< T > ;

  const auto I1 = qclab::dense::eye< T >( 2 ) ;
  const auto I2 = qclab::dense::eye< T >( 4 ) ;
  const auto I3 = qclab::dense::eye< T >( 8 ) ;

  const V v1 = { 3 , 5 } ;
  const V v2 = { 3 , 5 , 2 , 7 } ;
  const V v3 = { 3 , 5 , 2 , 7 , 4 , 1 , 8 , 3 } ;

  // apply (NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    X.apply( qclab::Op::NoTrans , 1 , vec1 ) ;
    V check1 = { 5 , 3 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { X.apply_device( qclab::Op::NoTrans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    X.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    V check2 = { 2 , 7 , 3 , 5 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { X.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    X.setQubit( 1 ) ;
    vec2 = v2 ;
    X.apply( qclab::Op::NoTrans , 2 , vec2 ) ;
    check2 = { 5 , 3 , 7 , 2 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { X.apply_device( qclab::Op::NoTrans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // nbQubits = 3
    auto vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    V check3 = { 2 , 7 , 3 , 5 , 8 , 3 , 4 , 1 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    X.setQubit( 0 ) ;
    vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 4 , 1 , 8 , 3 , 3 , 5 , 2 , 7 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    X.setQubit( 2 ) ;
    vec3 = v3 ;
    X.apply( qclab::Op::NoTrans , 3 , vec3 ) ;
    check3 = { 5 , 3 , 7 , 2 , 1 , 4 , 3 , 8 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { X.apply_device( qclab::Op::NoTrans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }

  // apply (Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;

    // nbQubits = 1
    auto vec1 = v1 ;
    Y.apply( qclab::Op::Trans , 1 , vec1 ) ;
    V check1 = { 5 , -3 } ;
    EXPECT_TRUE( vec1 == check1 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec1 = v1 ; T* vec1_ = vec1.data() ;
    #pragma omp target data map(tofrom:vec1_[0:2])
    { Y.apply_device( qclab::Op::Trans , 1 , vec1_ ) ; }
    EXPECT_TRUE( vec1 == check1 ) ;
  #endif

    // nbQubits = 2
    auto vec2 = v2 ;
    Y.apply( qclab::Op::Trans , 2 , vec2 ) ;
    V check2 = { 2 , 7 , -3 , -5 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ; T* vec2_ = vec2.data() ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { Y.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    Y.setQubit( 1 ) ;
    vec2 = v2 ;
    Y.apply( qclab::Op::Trans , 2 , vec2 ) ;
    check2 = { 5 , -3 , 7 , -2 } ;
    EXPECT_TRUE( vec2 == check2 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec2 = v2 ;
    #pragma omp target data map(tofrom:vec2_[0:4])
    { Y.apply_device( qclab::Op::Trans , 2 , vec2_ ) ; }
    EXPECT_TRUE( vec2 == check2 ) ;
  #endif

    // nbQubits = 3
    auto vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    V check3 = { 2 , 7 , -3 , -5 , 8 , 3 , -4 , -1 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ; T* vec3_ = vec3.data() ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    Y.setQubit( 0 ) ;
    vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    check3 = { 4 , 1 , 8 , 3 , -3 , -5 , -2 , -7 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif

    Y.setQubit( 2 ) ;
    vec3 = v3 ;
    Y.apply( qclab::Op::Trans , 3 , vec3 ) ;
    check3 = { 5 , -3 , 7 , -2 , 1 , -4 , 3 , -8 } ;
    EXPECT_TRUE( vec3 == check3 ) ;
  #ifdef QCLAB_OMP_OFFLOADING
    vec3 = v3 ;
    #pragma omp target data map(tofrom:vec3_[0:8])
    { Y.apply_device( qclab::Op::Trans , 3 , vec3_ ) ; }
    EXPECT_TRUE( vec3 == check3 ) ;
  #endif
  }


  // apply (Left + NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == X.matrix() ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 1 , mat1 ) ;
    M check1( 3 , 2 ,
              7 , 5 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( X.matrix() , I1 ) ) ;

    X.setQubit( 1 ) ;
    mat2 = I2 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , X.matrix() ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    X.apply( qclab::Side::Left , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( X.matrix() , I1 ) ) ) ;
  }

  // apply (Right + NoTrans)
  {
    qclab::qgates::PauliX< T >  X( 0 ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == X.matrix() ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 1 , mat1 ) ;
    M check1( 5 , 7 ,
              2 , 3 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( X.matrix() , I1 ) ) ;

    X.setQubit( 1 ) ;
    mat2 = I2 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , X.matrix() ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    X.apply( qclab::Side::Right , qclab::Op::NoTrans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( X.matrix() , I1 ) ) ) ;
  }

  // apply (Left + Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;
    M Ytrans = qclab::dense::trans( Y.matrix() ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == Ytrans ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 1 , mat1 ) ;
    M check1( -3 , 2 ,
              -7 , 5 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( Ytrans , I1 ) ) ;

    Y.setQubit( 1 ) ;
    mat2 = I2 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , Ytrans ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    Y.apply( qclab::Side::Left , qclab::Op::Trans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( Ytrans , I1 ) ) ) ;
  }

  // apply (Right + Trans)
  {
    qclab::qgates::RotationY< T >  Y( 0 , R(0) , R(1) ) ;
    M Ytrans = qclab::dense::trans( Y.matrix() ) ;

    // nbQubits = 1
    auto mat1 = I1 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 1 , mat1 ) ;
    EXPECT_TRUE( mat1 == Ytrans ) ;
    mat1 = M( 2 , 3 ,
              5 , 7 ) ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 1 , mat1 ) ;
    M check1(  5 ,  7 ,
              -2 , -3 ) ;
    EXPECT_TRUE( mat1 == check1 ) ;

    // nbQubits = 2
    auto mat2 = I2 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( Ytrans , I1 ) ) ;

    Y.setQubit( 1 ) ;
    mat2 = I2 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 2 , mat2 ) ;
    EXPECT_TRUE( mat2 == qclab::dense::kron( I1 , Ytrans ) ) ;

    // nbQubits = 3
    auto mat3 = I3 ;
    Y.apply( qclab::Side::Right , qclab::Op::Trans , 3 , mat3 ) ;
    EXPECT_TRUE( mat3 == qclab::dense::kron( I1 ,
                           qclab::dense::kron( Ytrans , I1 ) ) ) ;
  }

}